

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicStdLayoutBase3CS::Run(BasicStdLayoutBase3CS *this)

{
  pointer *this_00;
  allocator<unsigned_char> *this_01;
  byte bVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  GLint location;
  ostream *poVar5;
  undefined4 extraout_var;
  size_type sVar6;
  reference pvVar7;
  void *pvVar8;
  byte *pbVar9;
  CallLogWrapper *this_02;
  pointer *local_338;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_260;
  ulong local_258;
  size_t i;
  GLubyte *out_data_2;
  int j;
  bool status;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out_data_1;
  undefined1 local_220 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> out_data;
  string local_200;
  stringstream local_1d0 [8];
  stringstream ss;
  ostream local_1c0;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_data [2];
  BasicStdLayoutBase3CS *this_local;
  
  local_260 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48;
  in_data[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  do {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_260);
    local_260 = local_260 + 1;
  } while (local_260 !=
           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           &in_data[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::stringstream::stringstream(local_1d0);
  poVar5 = std::operator<<(&local_1c0,"layout(local_size_x = 1) in;\n");
  iVar3 = (*(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
            _vptr_GLWrapper[9])(this,local_48);
  std::operator<<(poVar5,(char *)CONCAT44(extraout_var,iVar3));
  std::__cxx11::stringstream::str();
  GVar4 = ShaderStorageBufferObjectBase::CreateProgramCS
                    (&this->super_ShaderStorageBufferObjectBase,&local_200);
  this->m_program = GVar4;
  std::__cxx11::string::~string((string *)&local_200);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_program);
  bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_program);
  if (bVar2) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,4,this->m_buffer);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8a11,0,this->m_buffer[0]);
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8a11,sVar6,pvVar7,0x88e4);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,this->m_buffer[1]);
    this_00 = &in_data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,sVar6,pvVar7,0x88e4);
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    this_01 = (allocator<unsigned_char> *)
              ((long)&out_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<unsigned_char>::allocator(this_01);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,sVar6,this_01);
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               ((long)&out_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,1,this->m_buffer[2]);
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,sVar6,pvVar7,0x88e4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &in_data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&out_data_2 + 7));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j,sVar6,
               (allocator<unsigned_char> *)((long)&out_data_2 + 7));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&out_data_2 + 7));
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,2,this->m_buffer[3]);
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &in_data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,sVar6,pvVar7,0x88e4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    this_02 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    location = glu::CallLogWrapper::glGetUniformLocation(this_02,this->m_program,"g_index1");
    glu::CallLogWrapper::glUniform1i(this_02,location,1);
    glu::CallLogWrapper::glDispatchCompute
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,1,1);
    out_data_2._6_1_ = 1;
    for (out_data_2._0_4_ = 0; (int)out_data_2 < 2; out_data_2._0_4_ = (int)out_data_2 + 1) {
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_buffer[(int)out_data_2 + 2]);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x200);
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &in_data[(long)(int)out_data_2 + -1].
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      pvVar8 = glu::CallLogWrapper::glMapBufferRange
                         (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                           super_GLWrapper.super_CallLogWrapper,0x90d2,0,sVar6,1);
      if (pvVar8 == (void *)0x0) {
        this_local = (BasicStdLayoutBase3CS *)&DAT_ffffffffffffffff;
        goto LAB_00fe94ad;
      }
      local_258 = 0;
      while( true ) {
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &in_data[(long)(int)out_data_2 + -1].
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (sVar6 <= local_258) break;
        pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &in_data[(long)(int)out_data_2 + -1].
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,local_258);
        if (*pvVar7 != *(value_type *)((long)pvVar8 + local_258)) {
          bVar1 = *(byte *)((long)pvVar8 + local_258);
          pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &in_data[(long)(int)out_data_2 + -1].
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,local_258);
          anon_unknown_0::Output
                    ("Byte at index %3d is %2x should be %2x.\n",local_258 & 0xffffffff,(ulong)bVar1
                     ,(ulong)*pbVar9);
          out_data_2._6_1_ = 0;
        }
        local_258 = local_258 + 1;
      }
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2);
    }
    if ((out_data_2._6_1_ & 1) == 0) {
      this_local = (BasicStdLayoutBase3CS *)&DAT_ffffffffffffffff;
    }
    else {
      this_local = (BasicStdLayoutBase3CS *)0x0;
    }
  }
  else {
    this_local = (BasicStdLayoutBase3CS *)&DAT_ffffffffffffffff;
  }
LAB_00fe94ad:
  out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  std::__cxx11::stringstream::~stringstream(local_1d0);
  local_338 = &in_data[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  do {
    local_338 = local_338 + -3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_338);
  } while (local_338 != (pointer *)local_48);
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		std::vector<GLubyte> in_data[2];

		std::stringstream ss;
		ss << "layout(local_size_x = 1) in;\n" << GetInput(in_data);
		m_program = CreateProgramCS(ss.str());
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(4, m_buffer);

		// input buffers
		glBindBufferBase(GL_UNIFORM_BUFFER, 0, m_buffer[0]);
		glBufferData(GL_UNIFORM_BUFFER, (GLsizeiptr)in_data[0].size(), &in_data[0][0], GL_STATIC_DRAW);

		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer[1]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data[1].size(), &in_data[1][0], GL_STATIC_DRAW);

		/* output buffer 0 */
		{
			std::vector<GLubyte> out_data(in_data[0].size());
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data[0].size(), &out_data[0], GL_STATIC_DRAW);
		}
		/* output buffer 1 */
		{
			std::vector<GLubyte> out_data(in_data[1].size());
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data[1].size(), &out_data[0], GL_STATIC_DRAW);
		}

		glUseProgram(m_program);
		glUniform1i(glGetUniformLocation(m_program, "g_index1"), 1);
		glDispatchCompute(1, 1, 1);

		bool status = true;
		for (int j = 0; j < 2; ++j)
		{
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer[j + 2]);
			glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
			GLubyte* out_data =
				(GLubyte*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)in_data[j].size(), GL_MAP_READ_BIT);
			if (!out_data)
				return ERROR;

			for (size_t i = 0; i < in_data[j].size(); ++i)
			{
				if (in_data[j][i] != out_data[i])
				{
					Output("Byte at index %3d is %2x should be %2x.\n", static_cast<int>(i), out_data[i],
						   in_data[j][i]);
					status = false;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		if (!status)
			return ERROR;
		return NO_ERROR;
	}